

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

bool __thiscall rcg::Buffer::isBigEndian(Buffer *this)

{
  PDSGetBufferInfo p_Var1;
  GC_ERROR GVar2;
  void *pvVar3;
  element_type *peVar4;
  undefined8 *in_RDI;
  GC_ERROR err;
  size_t size;
  int32_t v;
  INFO_DATATYPE type;
  bool ret;
  size_t local_20;
  int local_14;
  int local_10;
  byte local_9;
  
  local_9 = 0;
  local_20 = 4;
  pvVar3 = Stream::getHandle((Stream *)*in_RDI);
  if ((pvVar3 != (void *)0x0) && (in_RDI[3] != 0)) {
    peVar4 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x128b01);
    p_Var1 = peVar4->DSGetBufferInfo;
    pvVar3 = Stream::getHandle((Stream *)*in_RDI);
    GVar2 = (*p_Var1)(pvVar3,(BUFFER_HANDLE)in_RDI[3],0x1a,&local_10,&local_14,&local_20);
    if ((GVar2 == 0) && ((local_10 == 5 && (local_14 == 2)))) {
      local_9 = 1;
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool Buffer::isBigEndian() const
{
  bool ret=false;

  GenTL::INFO_DATATYPE type;
  int32_t v;
  size_t size=sizeof(v);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (parent->getHandle() != 0 && buffer != 0)
  {
    err=gentl->DSGetBufferInfo(parent->getHandle(), buffer, GenTL::BUFFER_INFO_PIXEL_ENDIANNESS,
                               &type, &v, &size);

    if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_INT32 &&
        v == GenTL::PIXELENDIANNESS_BIG)
    {
      ret=true;
    }
  }

  return ret;
}